

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit
          (TypePrinter *this,FixedSizeUnpackedArrayType *type,string_view param_3)

{
  string_view str;
  string_view str_00;
  format_string<unsigned_int> fmt;
  format_string<const_int_&,_const_int_&> fmt_00;
  bool bVar1;
  int32_t iVar2;
  pointer pFVar3;
  pointer __str;
  long in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000005b0;
  TypePrinter *in_stack_000005b8;
  Symbol *in_stack_000005c0;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  uint *local_78;
  FormatBuffer *in_stack_ffffffffffffff98;
  TypePrinter *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  if (*(int *)(in_RDI + 8) == 1) {
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0xa981fc);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    str._M_str = in_RDI;
    str._M_len = (size_t)pFVar3;
    FormatBuffer::append(in_stack_ffffffffffffff70,str);
    bVar1 = ConstantRange::isLittleEndian((ConstantRange *)(in_RSI + 0x50));
    if ((bVar1) || (iVar2 = ConstantRange::lower((ConstantRange *)0xa9824f), iVar2 != 0)) {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0xa982ba);
      fmt_00.str.size_ = in_stack_ffffffffffffffc8;
      fmt_00.str.data_ = in_stack_ffffffffffffffc0;
      FormatBuffer::format<int_const&,int_const&>
                ((FormatBuffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 fmt_00,(int *)0x7,(int *)0xb29024);
    }
    else {
      in_stack_ffffffffffffff70 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0xa98262);
      ConstantRange::width((ConstantRange *)0xa9828d);
      fmt.str.size_ = in_stack_ffffffffffffffa8;
      fmt.str.data_ = (char *)in_stack_ffffffffffffffa0;
      FormatBuffer::format<unsigned_int>(in_stack_ffffffffffffff98,fmt,local_78);
    }
    __str = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
            operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *
                       )0xa9830b);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    str_00._M_str = in_RDI;
    str_00._M_len = (size_t)pFVar3;
    FormatBuffer::append(in_stack_ffffffffffffff70,str_00);
    sv((char *)__str,in_stack_ffffffffffffff58);
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
    return;
  }
  printUnpackedArray(in_stack_ffffffffffffffa0,(Type *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

void TypePrinter::visit(const FixedSizeUnpackedArrayType& type, std::string_view) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        buffer->append("unpacked array ");
        if (!type.range.isLittleEndian() && type.range.lower() == 0)
            buffer->format("[{}]", type.range.width());
        else
            buffer->format("[{}:{}]", type.range.left, type.range.right);

        buffer->append(" of ");
        type.elementType.visit(*this, ""sv);
    }
    else {
        printUnpackedArray(type);
    }
}